

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,4ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,4ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  char **txt;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX_00;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  undefined8 uVar5;
  ulong uVar6;
  ostringstream os;
  string local_1d0;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  to_string_abi_cxx11_(&local_1d0,(lest *)this,txt);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  paVar2 = &local_1d0.field_2;
  tuple_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    tuple_00 = extraout_RDX_00;
  }
  make_tuple_string<std::tuple<char,int,double,char_const*>,3ul>::make_abi_cxx11_
            (&local_1d0,(make_tuple_string<std::tuple<char,int,double,char_const*>,3ul> *)this,
             tuple_00);
  std::__cxx11::stringbuf::str();
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    uVar5 = local_1d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_1a8 + local_1d0._M_string_length) {
    uVar6 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar6 = local_1a0[0];
    }
    if (local_1a8 + local_1d0._M_string_length <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
      goto LAB_0018de4d;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1b0);
LAB_0018de4d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar5 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }